

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

path * boost::filesystem::detail::canonical
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  error_category *peVar6;
  path *ppVar7;
  filesystem_error *pfVar8;
  error_code ec_00;
  error_code ec_01;
  iterator itr;
  path result;
  path source;
  path new_source;
  path link;
  error_code local_resd8;
  file_status stat;
  path root;
  iterator local_158;
  path local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  path local_100;
  path local_e0;
  path local_c0;
  error_code local_a0;
  long *local_90;
  long local_80 [2];
  path *local_70;
  size_type local_68;
  int local_60 [2];
  int local_58 [2];
  path local_50;
  
  bVar4 = path::has_root_directory(p);
  if (bVar4) {
    local_100.m_pathname._M_dataplus._M_p = (pointer)&local_100.m_pathname.field_2;
    pcVar1 = (p->m_pathname)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + (p->m_pathname)._M_string_length);
  }
  else {
    absolute(&local_100,p,base);
  }
  path::root_path(&local_50,&local_100);
  local_128.m_pathname._M_dataplus._M_p = (pointer)&local_128.m_pathname.field_2;
  local_128.m_pathname._M_string_length = 0;
  local_128.m_pathname.field_2._M_local_buf[0] = '\0';
  local_a0.m_val = 0;
  local_a0.m_cat = system::system_category();
  status((detail *)local_58,&local_100,&local_a0);
  if (local_58[0] == 1) {
    if (ec == (error_code *)0x0) {
      pfVar8 = (filesystem_error *)__cxa_allocate_exception(0x50);
      local_158.m_element.m_pathname._M_dataplus._M_p =
           (pointer)&local_158.m_element.m_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"boost::filesystem::canonical","");
      peVar6 = system::generic_category();
      ec_00.m_cat = peVar6;
      ec_00._0_8_ = 2;
      filesystem_error::filesystem_error(pfVar8,(string *)&local_158,&local_100,ec_00);
      __cxa_throw(pfVar8,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    peVar6 = system::generic_category();
    ec->m_val = 2;
    ec->m_cat = peVar6;
  }
  else {
    if (local_a0.m_val == 0) {
      local_108 = &(__return_storage_ptr__->m_pathname).field_2;
      bVar4 = true;
      do {
        if (!bVar4) {
          if (ec != (error_code *)0x0) {
            ec->m_val = 0;
            peVar6 = system::system_category();
            ec->m_cat = peVar6;
          }
          bVar4 = path::has_root_directory(&local_128);
          if (!bVar4) {
            __assert_fail("(result.is_absolute())&&(\"canonical() implementation error; please report\")"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                          ,0x368,
                          "path boost::filesystem::detail::canonical(const path &, const path &, system::error_code *)"
                         );
          }
          goto LAB_0010b4db;
        }
        local_128.m_pathname._M_string_length = 0;
        *local_128.m_pathname._M_dataplus._M_p = '\0';
        path::begin(&local_158,&local_100);
        bVar4 = false;
        while( true ) {
          path::end(&local_100);
          bVar2 = local_68 == local_158.m_pos;
          bVar3 = local_158.m_path_ptr == local_70;
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          if (bVar2 && bVar3) break;
          ppVar7 = dot_path();
          iVar5 = path::compare(&local_158.m_element,ppVar7);
          if (iVar5 != 0) {
            ppVar7 = dot_dot_path();
            iVar5 = path::compare(&local_158.m_element,ppVar7);
            if (iVar5 == 0) {
              iVar5 = path::compare(&local_128,&local_50);
              if (iVar5 != 0) {
                path::remove_filename(&local_128);
              }
            }
            else {
              path::operator/=(&local_128,&local_158.m_element);
              symlink_status((detail *)local_60,&local_128,ec);
              if ((ec == (error_code *)0x0) || (ec->m_val == 0)) {
                iVar5 = 0;
                if (local_60[0] == 4) {
                  read_symlink(&local_c0,&local_128,ec);
                  if ((ec == (error_code *)0x0) || (ec->m_val == 0)) {
                    path::remove_filename(&local_128);
                    bVar4 = path::has_root_directory(&local_c0);
                    if (bVar4) {
                      path::m_path_iterator_increment(&local_158);
                      while( true ) {
                        path::end(&local_100);
                        bVar4 = local_68 == local_158.m_pos;
                        bVar2 = local_158.m_path_ptr == local_70;
                        if (local_90 != local_80) {
                          operator_delete(local_90,local_80[0] + 1);
                        }
                        if (bVar4 && bVar2) break;
                        path::operator/=(&local_c0,&local_158.m_element);
                        path::m_path_iterator_increment(&local_158);
                      }
                      std::__cxx11::string::_M_assign((string *)&local_100);
                    }
                    else {
                      local_e0.m_pathname._M_dataplus._M_p = (pointer)&local_e0.m_pathname.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_e0,local_128.m_pathname._M_dataplus._M_p,
                                 local_128.m_pathname._M_dataplus._M_p +
                                 local_128.m_pathname._M_string_length);
                      path::operator/=(&local_e0,&local_c0);
                      path::m_path_iterator_increment(&local_158);
                      while( true ) {
                        path::end(&local_100);
                        bVar4 = local_68 == local_158.m_pos;
                        bVar2 = local_158.m_path_ptr == local_70;
                        if (local_90 != local_80) {
                          operator_delete(local_90,local_80[0] + 1);
                        }
                        if (bVar4 && bVar2) break;
                        path::operator/=(&local_e0,&local_158.m_element);
                        path::m_path_iterator_increment(&local_158);
                      }
                      std::__cxx11::string::_M_assign((string *)&local_100);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0.m_pathname._M_dataplus._M_p != &local_e0.m_pathname.field_2) {
                        operator_delete(local_e0.m_pathname._M_dataplus._M_p,
                                        local_e0.m_pathname.field_2._M_allocated_capacity + 1);
                      }
                    }
                    bVar4 = true;
                    iVar5 = 4;
                  }
                  else {
                    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)local_108;
                    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
                    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
                    iVar5 = 1;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0.m_pathname._M_dataplus._M_p != &local_c0.m_pathname.field_2) {
                    operator_delete(local_c0.m_pathname._M_dataplus._M_p,
                                    local_c0.m_pathname.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              else {
                (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)local_108;
                (__return_storage_ptr__->m_pathname)._M_string_length = 0;
                (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
                iVar5 = 1;
              }
              if (iVar5 != 0) goto LAB_0010b489;
            }
          }
          path::m_path_iterator_increment(&local_158);
        }
        iVar5 = 4;
LAB_0010b489:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.m_element.m_pathname._M_dataplus._M_p !=
            &local_158.m_element.m_pathname.field_2) {
          operator_delete(local_158.m_element.m_pathname._M_dataplus._M_p,
                          local_158.m_element.m_pathname.field_2._M_allocated_capacity + 1);
        }
      } while (iVar5 == 4);
      goto LAB_0010b4fd;
    }
    if (ec == (error_code *)0x0) {
      pfVar8 = (filesystem_error *)__cxa_allocate_exception(0x50);
      local_158.m_element.m_pathname._M_dataplus._M_p =
           (pointer)&local_158.m_element.m_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"boost::filesystem::canonical","");
      ec_01._4_4_ = 0;
      ec_01.m_val = local_a0.m_val;
      ec_01.m_cat = local_a0.m_cat;
      filesystem_error::filesystem_error(pfVar8,(string *)&local_158,&local_100,ec_01);
      __cxa_throw(pfVar8,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    *(ulong *)ec = CONCAT44(local_a0._4_4_,local_a0.m_val);
    ec->m_cat = local_a0.m_cat;
  }
LAB_0010b4db:
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_128);
LAB_0010b4fd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.m_pathname._M_dataplus._M_p != &local_128.m_pathname.field_2) {
    operator_delete(local_128.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_128.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_128.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_pathname._M_dataplus._M_p != &local_50.m_pathname.field_2) {
    operator_delete(local_50.m_pathname._M_dataplus._M_p,
                    local_50.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_pathname._M_dataplus._M_p != &local_100.m_pathname.field_2) {
    operator_delete(local_100.m_pathname._M_dataplus._M_p,
                    local_100.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path canonical(const path& p, const path& base, system::error_code* ec)
  {
    path source (p.is_absolute() ? p : absolute(p, base));
    path root(source.root_path());
    path result;

    system::error_code local_ec;
    file_status stat (status(source, local_ec));

    if (stat.type() == fs::file_not_found)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source,
          error_code(system::errc::no_such_file_or_directory, system::generic_category())));
      ec->assign(system::errc::no_such_file_or_directory, system::generic_category());
      return result;
    }
    else if (local_ec)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source, local_ec));
      *ec = local_ec;
      return result;
    }

    bool scan (true);
    while (scan)
    {
      scan = false;
      result.clear();
      for (path::iterator itr = source.begin(); itr != source.end(); ++itr)
      {
        if (*itr == dot_path())
          continue;
        if (*itr == dot_dot_path())
        {
          if (result != root)
            result.remove_filename();
          continue;
        }

        result /= *itr;

        bool is_sym (is_symlink(detail::symlink_status(result, ec)));
        if (ec && *ec)
          return path();

        if (is_sym)
        {
          path link(detail::read_symlink(result, ec));
          if (ec && *ec)
            return path();
          result.remove_filename();

          if (link.is_absolute())
          {
            for (++itr; itr != source.end(); ++itr)
              link /= *itr;
            source = link;
          }
          else // link is relative
          {
            path new_source(result);
            new_source /= link;
            for (++itr; itr != source.end(); ++itr)
              new_source /= *itr;
            source = new_source;
          }
          scan = true;  // symlink causes scan to be restarted
          break;
        }
      }
    }
    if (ec != 0)
      ec->clear();
    BOOST_ASSERT_MSG(result.is_absolute(), "canonical() implementation error; please report");
    return result;
  }